

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void fight_prog_gking(CHAR_DATA *mob,CHAR_DATA *victim)

{
  bool bVar1;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  CHAR_DATA *gar2;
  CHAR_DATA *gar1;
  char *in_stack_00002428;
  CHAR_DATA *in_stack_00002430;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 uVar2;
  short sVar3;
  undefined2 uVar4;
  ROOM_INDEX_DATA *in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  
  if ((in_RDI->hit * 100) / (int)in_RDI->max_hit < 0x4b) {
    bVar1 = is_affected(in_RDI,(int)gsn_gking);
    if (!bVar1) {
      init_affect((AFFECT_DATA *)0x682fc5);
      uVar2 = 0;
      uVar5 = 1;
      uVar4 = 0x33;
      sVar3 = gsn_gking;
      affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      get_mob_index(in_stack_ffffffffffffff8c);
      create_mobile((MOB_INDEX_DATA *)af.end_fun);
      get_mob_index(in_stack_ffffffffffffff8c);
      create_mobile((MOB_INDEX_DATA *)af.end_fun);
      act((char *)CONCAT26(uVar4,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      char_to_room((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),in_stack_ffffffffffffffa8)
      ;
      char_to_room((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),in_stack_ffffffffffffffa8)
      ;
      act((char *)CONCAT26(uVar4,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      act((char *)CONCAT26(uVar4,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      do_murder(in_stack_00002430,in_stack_00002428);
      act((char *)CONCAT26(uVar4,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      act((char *)CONCAT26(uVar4,CONCAT24(sVar3,CONCAT22(uVar2,in_stack_ffffffffffffff90))),
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      do_murder(in_stack_00002430,in_stack_00002428);
    }
  }
  return;
}

Assistant:

void fight_prog_gking(CHAR_DATA *mob, CHAR_DATA *victim)
{
	CHAR_DATA *gar1, *gar2;
	AFFECT_DATA af;

	if ((mob->hit * 100 / mob->max_hit) < 75 && !is_affected(mob, gsn_gking))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_gking;
		af.aftype = AFT_SKILL;
		af.level = 51;
		af.duration = 15;
		affect_to_char(mob, &af);

		gar1 = create_mobile(get_mob_index(2233));
		gar2 = create_mobile(get_mob_index(2233));

		act("$n gestures slightly animating the two mithril statues next to the throne!", mob, 0, 0, TO_ROOM);

		char_to_room(gar1, mob->in_room);
		char_to_room(gar2, mob->in_room);

		act("$n screams and attacks you!", gar1, 0, victim, TO_VICT);
		act("$n screams and attacks $N!", gar1, 0, victim, TO_NOTVICT);

		do_murder(gar1, victim->name);

		act("$n screams and attacks you!", gar2, 0, victim, TO_VICT);
		act("$n screams and attacks $N!", gar2, 0, victim, TO_NOTVICT);

		do_murder(gar2, victim->name);
	}
}